

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segdmp.c
# Opt level: O0

int segdmp_open_write(char **dirs,char *dfn,char *ifn,uint32 n,uint32 *in_n_seg,uint32 **in_n_frame,
                     segdmp_type_t data_type,uint32 i_n_stream,uint32 *i_vecsize,uint32 i_blksize)

{
  int32 iVar1;
  int iVar2;
  cmd_ln_t *cmdln;
  FILE *pFVar3;
  long lVar4;
  uint32 local_54;
  uint32 hdr_sz;
  uint32 part;
  uint32 j;
  uint32 i;
  uint32 n_tot_frame;
  uint32 n_dir;
  uint32 n_dmp_frame_max;
  uint32 n_dmp_min;
  uint32 **in_n_frame_local;
  uint32 *in_n_seg_local;
  uint32 n_local;
  char *ifn_local;
  char *dfn_local;
  char **dirs_local;
  
  n_stream = i_n_stream;
  vecsize = i_vecsize;
  blksize = i_blksize;
  n_seg = in_n_seg;
  n_frame = in_n_frame;
  printf("dfn is %s\n",dfn);
  printf("ifn is %s\n",ifn);
  fflush(_stdout);
  for (i = 0; dirs[i] != (char *)0x0; i = i + 1) {
  }
  cur_type = data_type;
  if (data_type == SEGDMP_TYPE_FEAT) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
            ,0x1d5,"Producing FEAT dump\n");
  }
  else if (data_type == SEGDMP_TYPE_MFCC) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
            ,0x1d8,"Producing MFCC dump\n");
  }
  else if (data_type == SEGDMP_TYPE_VQ) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
            ,0x1db,"Producing VQ dump\n");
  }
  j = 0;
  for (part = 0; part < n; part = part + 1) {
    if (n_frame == (uint32 **)0x0) {
      j = n_seg[part] + j;
    }
    else {
      for (hdr_sz = 0; hdr_sz < n_seg[part]; hdr_sz = hdr_sz + 1) {
        j = n_frame[part][hdr_sz] + j;
      }
    }
  }
  n_id = n;
  id_part = (uint32 *)
            __ckd_calloc__((ulong)n,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                           ,0x1ec);
  id_off = (uint32 *)
           __ckd_calloc__((ulong)n_id,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                          ,0x1ed);
  id_len = (uint32 *)
           __ckd_calloc__((ulong)n_id,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                          ,0x1ee);
  if (cur_type == SEGDMP_TYPE_FEAT) {
    frame_sz = blksize << 2;
  }
  else if (cur_type == SEGDMP_TYPE_VQ) {
    frame_sz = 4;
  }
  else if (cur_type == SEGDMP_TYPE_MFCC) {
    cmdln = cmd_ln_get();
    lVar4 = cmd_ln_int_r(cmdln,"-ceplen");
    frame_sz = (int)lVar4 << 2;
  }
  n_tot_frame = (uint32)(0x7f000000 / (ulong)frame_sz);
  if ((int)(0x7f000000 % (ulong)frame_sz) != 0) {
    n_tot_frame = n_tot_frame + 1;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
          ,0x205,"%u total frames; %u frames/dmp max\n",(ulong)j,(ulong)n_tot_frame);
  local_54 = 0;
  *id_part = 0;
  *id_off = 0;
  if (n_frame == (uint32 **)0x0) {
    *id_len = *n_seg;
  }
  else {
    for (hdr_sz = 0; hdr_sz < *n_seg; hdr_sz = hdr_sz + 1) {
      *id_len = (*n_frame)[hdr_sz] + *id_len;
    }
  }
  if (0x7f000000 < *id_len * frame_sz) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
            ,0x214,"ID 0 has more data (%u bytes) than DMP_MAX (%u bytes); Increase DMP_MAX\n",
            (ulong)(*id_len * frame_sz),0x7f000000);
    exit(1);
  }
  for (part = 1; part < n_id; part = part + 1) {
    id_off[part] = id_off[part - 1] + id_len[part - 1] * frame_sz;
    if (0x7f000000 < id_off[part]) {
      local_54 = local_54 + 1;
      id_off[part] = 0;
    }
    id_part[part] = local_54;
    if (n_frame == (uint32 **)0x0) {
      id_len[part] = n_seg[part];
    }
    else {
      for (hdr_sz = 0; hdr_sz < n_seg[part]; hdr_sz = hdr_sz + 1) {
        id_len[part] = n_frame[part][hdr_sz] + id_len[part];
      }
    }
  }
  n_part = local_54 + 1;
  if (i < n_part) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
            ,0x237,"%u directories required, but only %u given\n",(ulong)n_part,(ulong)i);
    exit(1);
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
          ,0x233,"%u of %u directories filled\n",(ulong)n_part,(ulong)i);
  dmp_fp = (FILE **)__ckd_calloc__((ulong)n_part,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                   ,0x23b);
  for (part = 0; part < n_part; part = part + 1) {
    sprintf(dmp_fn,"%s/%s",dirs[part],dfn);
    pFVar3 = s3open(dmp_fn,"wb",(uint32 *)0x0);
    dmp_fp[part] = pFVar3;
    lVar4 = ftell((FILE *)dmp_fp[part]);
    for (hdr_sz = 0; hdr_sz < n_id; hdr_sz = hdr_sz + 1) {
      if (id_part[hdr_sz] == part) {
        id_off[hdr_sz] = (int)lVar4 + id_off[hdr_sz];
      }
    }
  }
  idx_fp = (FILE **)__ckd_calloc__((ulong)n_part,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                   ,0x249);
  if (ifn == (char *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
            ,0x25f,"Assuming prior indices are available and appropriate\n");
  }
  else {
    for (part = 0; part < n_part; part = part + 1) {
      sprintf(idx_fn,"%s/%s",dirs[part],ifn);
      pFVar3 = s3open(idx_fn,"wb",(uint32 *)0x0);
      idx_fp[part] = pFVar3;
      iVar1 = bio_fwrite(&data_type,4,1,idx_fp[part],0,&ignore);
      if (iVar1 != 1) {
        err_msg_system(ERR_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                       ,0x252,"unable to write seg dmp file");
        exit(1);
      }
      iVar2 = write_idx(part);
      if (iVar2 == 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                ,0x255,"Created index %s/%s\n",dirs[part],ifn);
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                ,600,"Error creating index %s/%s\n",dirs[part],ifn);
      }
      s3close(idx_fp[part]);
    }
  }
  ckd_free(idx_fp);
  idx_fp = (FILE **)0x0;
  alloc_frm_buf = frm_buf_sz / frame_sz;
  printf("frm_buf_size is %d frame_sz is %d\n",(ulong)frm_buf_sz,(ulong)frame_sz);
  fflush(_stdout);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
          ,0x269,"%u frames buffered before write\n",(ulong)alloc_frm_buf);
  alloc_frm_buf = frame_sz * alloc_frm_buf;
  frm_buf = (char *)__ckd_calloc__((ulong)alloc_frm_buf,1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                   ,0x26c);
  if (frm_buf == (char *)0x0) {
    printf("died like a pig\n");
    exit(1);
  }
  h_seg = (seg_t **)
          __ckd_calloc__((ulong)n_id,8,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                         ,0x270);
  t_seg = (seg_t **)
          __ckd_calloc__((ulong)n_id,8,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                         ,0x271);
  cur_type = data_type;
  return 0;
}

Assistant:

int
segdmp_open_write(const char **dirs,		/* directories available for dump files */
		  const char *dfn,		/* dump file name */
		  const char *ifn,		/* index file name */
		  uint32 n,			/* # of segment id's (i.e. phones, states, etc.)*/
		  uint32 *in_n_seg,		/* # of segments per id */
		  uint32 **in_n_frame,		/* length of each segment in # of frames */
		  segdmp_type_t data_type,	/* type of data to store in segment dump */
		  uint32 i_n_stream,
		  uint32* i_vecsize,
		  uint32 i_blksize)
{
    uint32 n_dmp_min;
    uint32 n_dmp_frame_max;
    uint32 n_dir;
    uint32 n_tot_frame;
    uint32 i, j;
    uint32 part = 0;
    uint32 hdr_sz;
    
    n_seg = in_n_seg;
    n_frame = in_n_frame;	/* NULL => 1 frame per segment */

    n_stream = i_n_stream;
    vecsize = i_vecsize;
    blksize = i_blksize;

    printf("dfn is %s\n", dfn);
    printf("ifn is %s\n", ifn);
    fflush(stdout);

    for (n_dir = 0; dirs[n_dir]; n_dir++);

    cur_type = data_type;

    if (cur_type == SEGDMP_TYPE_FEAT) {
	E_INFO("Producing FEAT dump\n");
    }
    else if (cur_type == SEGDMP_TYPE_MFCC) {
	E_INFO("Producing MFCC dump\n");
    }
    else if (cur_type == SEGDMP_TYPE_VQ) {
	E_INFO("Producing VQ dump\n");
    }

    for (n_tot_frame = 0, i = 0; i < n; i++) {
	if (n_frame == NULL) {
	    /* one frame segments, so n_seg == n_frame */
	    n_tot_frame += n_seg[i];
	}
	else {
	    for (j = 0; j < n_seg[i]; j++) {
		n_tot_frame += n_frame[i][j];
	    }
	}
    }

    n_id = n;

    id_part = ckd_calloc(n_id, sizeof(uint32));
    id_off = ckd_calloc(n_id, sizeof(uint32));
    id_len = ckd_calloc(n_id, sizeof(uint32));
    
    if (cur_type == SEGDMP_TYPE_FEAT) {
	frame_sz = blksize * sizeof(float32);
    }
    else if (cur_type == SEGDMP_TYPE_VQ) {
	frame_sz = 4;	/* HAQUE */
    }
    else if (cur_type == SEGDMP_TYPE_MFCC) {
	/* Ideally, this module shouldn't be calling cmd_ln_* functions */
	frame_sz = cmd_ln_int32("-ceplen") * sizeof(float32);
    }

    n_dmp_frame_max = (DMP_MAX / frame_sz);
    
    if (DMP_MAX % frame_sz)
	++n_dmp_frame_max;
    
    n_dmp_min = n_tot_frame / n_dmp_frame_max;

    if (n_tot_frame % n_dmp_frame_max)
	++n_dmp_min;
    
    E_INFO("%u total frames; %u frames/dmp max\n", n_tot_frame, n_dmp_frame_max);

    part = 0;
    id_part[0] = part;
    id_off[0] = 0;
    if (n_frame == NULL) {
	id_len[0] = n_seg[0];
    }
    else {
	for (j = 0; j < n_seg[0]; j++) {
	    id_len[0] += n_frame[0][j];
	}
    }

    if (id_len[0] * frame_sz > DMP_MAX) {
	E_FATAL("ID 0 has more data (%u bytes) than DMP_MAX (%u bytes); Increase DMP_MAX\n", id_len[0]*frame_sz, DMP_MAX);
    }

    /* compute dump part, offset and len for all remaining id's */
    for (i = 1; i < n_id; i++) {
	id_off[i] = id_off[i-1] + id_len[i-1] * frame_sz;

	if (id_off[i] > DMP_MAX) {
	    ++part;
	    id_off[i] = 0;
	}

	id_part[i] = part;

	if (n_frame == NULL) {
	    /* i.e. 1 frame per segment */
	    id_len[i] = n_seg[i];
	}
	else {
	    for (j = 0; j < n_seg[i]; j++) {
		id_len[i] += n_frame[i][j];
	    }
	}
    }

    ++part;

    n_part = part;

    if (n_part <= n_dir) {
	E_INFO("%u of %u directories filled\n",
	       n_part, n_dir);
    }
    else {
	E_FATAL("%u directories required, but only %u given\n",
		n_part, n_dir);
    }

    /* Create/open the dump files */
    dmp_fp = ckd_calloc(n_part, sizeof(FILE *));
    for (i = 0; i < n_part; i++) {
	sprintf(dmp_fn, "%s/%s", dirs[i], dfn);

	dmp_fp[i] = s3open(dmp_fn, "wb", NULL);

	/* add the file header size to all the offsets computed above. */
	hdr_sz = ftell(dmp_fp[i]);
	for (j = 0; j < n_id; j++) {
	    if (id_part[j] == i)
		id_off[j] += hdr_sz;
	}
    }

    idx_fp = ckd_calloc(n_part, sizeof(FILE *));
    if (ifn) {
	for (i = 0; i < n_part; i++) {
	    /* Create the index file */
	    sprintf(idx_fn, "%s/%s", dirs[i], ifn);
	    
	    idx_fp[i] = s3open(idx_fn, "wb", NULL);
	    
	    if (bio_fwrite((int *)&data_type, sizeof(int), 1, idx_fp[i], 0, &ignore) != 1) {
		E_FATAL_SYSTEM("unable to write seg dmp file");
	    }
	    if (write_idx(i) == S3_SUCCESS) {
		E_INFO("Created index %s/%s\n", dirs[i], ifn);
	    }
	    else {
		E_INFO("Error creating index %s/%s\n", dirs[i], ifn);
	    }
		
	    s3close(idx_fp[i]);
	}
    }
    else {
	E_INFO("Assuming prior indices are available and appropriate\n");
    }

    ckd_free((void *)idx_fp);
    idx_fp = NULL;

    alloc_frm_buf = frm_buf_sz / frame_sz;
    printf("frm_buf_size is %d frame_sz is %d\n", frm_buf_sz , frame_sz);
    fflush(stdout);

    E_INFO("%u frames buffered before write\n", alloc_frm_buf);
    alloc_frm_buf *= frame_sz;			/* make a multiple of frame_sz */

    if ((frm_buf = (void *)ckd_calloc(alloc_frm_buf, sizeof(char)) )==NULL) {
	printf("died like a pig\n");
	exit(1);
    }
    h_seg = (seg_t **)ckd_calloc(n_id, sizeof(seg_t *));
    t_seg = (seg_t **)ckd_calloc(n_id, sizeof(seg_t *));

    cur_type = data_type;
    
    return S3_SUCCESS;
}